

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O1

void xmlParserPrintFileInfo(xmlParserInputPtr input)

{
  char *pcVar1;
  xmlGenericErrorFunc UNRECOVERED_JUMPTABLE_00;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  
  if (input == (xmlParserInputPtr)0x0) {
    return;
  }
  pcVar1 = input->filename;
  pp_Var2 = __xmlGenericError();
  UNRECOVERED_JUMPTABLE_00 = *pp_Var2;
  ppvVar3 = __xmlGenericErrorContext();
  if (pcVar1 != (char *)0x0) {
    (*UNRECOVERED_JUMPTABLE_00)
              (*ppvVar3,"%s:%d: ",input->filename,(ulong)(uint)input->line,UNRECOVERED_JUMPTABLE_00)
    ;
    return;
  }
  (*UNRECOVERED_JUMPTABLE_00)
            (*ppvVar3,"Entity: line %d: ",(ulong)(uint)input->line,UNRECOVERED_JUMPTABLE_00);
  return;
}

Assistant:

void
xmlParserPrintFileInfo(xmlParserInputPtr input) {
    if (input != NULL) {
	if (input->filename)
	    xmlGenericError(xmlGenericErrorContext,
		    "%s:%d: ", input->filename,
		    input->line);
	else
	    xmlGenericError(xmlGenericErrorContext,
		    "Entity: line %d: ", input->line);
    }
}